

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int BUFFER_safemalloc(BUFFER *handleptr,size_t size)

{
  uchar *puVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  size_t sizetomalloc;
  int result;
  size_t size_local;
  BUFFER *handleptr_local;
  
  l = (LOGGER_LOG)size;
  if (size == 0) {
    l = (LOGGER_LOG)0x1;
  }
  puVar1 = (uchar *)malloc((size_t)l);
  handleptr->buffer = puVar1;
  if (handleptr->buffer == (uchar *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
                ,"BUFFER_safemalloc",0x2c,1,"Failure allocating data");
    }
    sizetomalloc._4_4_ = 0x2d;
  }
  else {
    handleptr->size = size;
    sizetomalloc._4_4_ = 0;
  }
  return sizetomalloc._4_4_;
}

Assistant:

static int BUFFER_safemalloc(BUFFER* handleptr, size_t size)
{
    int result;
    size_t sizetomalloc = size;
    if (size == 0)
    {
        sizetomalloc = 1;
    }
    handleptr->buffer = (unsigned char*)malloc(sizetomalloc);
    if (handleptr->buffer == NULL)
    {
        /*Codes_SRS_BUFFER_02_003: [If allocating memory fails, then BUFFER_create shall return NULL.]*/
        LogError("Failure allocating data");
        result = MU_FAILURE;
    }
    else
    {
        // we still consider the real buffer size is 0
        handleptr->size = size;
        result = 0;
    }
    return result;
}